

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MetaVariable::set_value<tinyusdz::value::matrix4f>(MetaVariable *this,matrix4f *v)

{
  string local_38 [32];
  matrix4f *local_18;
  matrix4f *v_local;
  MetaVariable *this_local;
  
  local_18 = v;
  v_local = (matrix4f *)this;
  tinyusdz::value::Value::operator=(&this->_value,v);
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::operator=((string *)&this->_name,local_38);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }